

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128.cpp
# Opt level: O3

void __thiscall MetroHash128::Finalize(MetroHash128 *this,uint8_t *hash)

{
  uint8_t *puVar1;
  long lVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  anon_struct_32_1_54a39802_for_input *paVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  uVar3 = (this->state).v[0];
  uVar6 = this->bytes;
  if (0x1f < uVar6) {
    uVar5 = (this->state).v[3];
    uVar11 = (this->state).v[1];
    uVar8 = (uVar5 + uVar3) * 0xc83a91e1 + uVar11;
    uVar9 = (uVar8 >> 0x15 | uVar8 << 0x2b) * 0x8648dbdb ^ (this->state).v[2];
    (this->state).v[2] = uVar9;
    uVar8 = (uVar9 + uVar11) * 0x8648dbdb + uVar3;
    uVar5 = (uVar8 >> 0x15 | uVar8 << 0x2b) * 0xc83a91e1 ^ uVar5;
    uVar8 = (uVar9 + uVar3) * 0xc83a91e1 + uVar5;
    (this->state).v[3] = uVar5;
    uVar9 = (uVar5 + uVar11) * 0x8648dbdb + uVar9;
    uVar3 = uVar3 ^ (uVar8 >> 0x15 | uVar8 << 0x2b) * 0x8648dbdb;
    (this->state).v[0] = uVar3;
    (this->state).v[1] = (uVar9 >> 0x15 | uVar9 << 0x2b) * 0xc83a91e1 ^ uVar11;
  }
  uVar6 = (ulong)((uint)uVar6 & 0x1f);
  lVar2 = uVar6 + 0x20;
  if (uVar6 < 0x10) {
    paVar7 = &this->input;
  }
  else {
    uVar6 = *(long *)((this->input).b + 8) * 0x7bdec03b + (this->state).v[1];
    uVar3 = uVar3 + *(long *)(this->input).b * 0x7bdec03b;
    paVar7 = (anon_struct_32_1_54a39802_for_input *)((this->input).b + 0x10);
    uVar3 = uVar3 >> 0x21 | uVar3 * 0x80000000;
    uVar5 = uVar6 >> 0x21 | uVar6 * 0x80000000;
    uVar11 = uVar5 * 0x2f5870a5;
    uVar6 = uVar3 * 0x16e8b05e33f3b607 + uVar11;
    uVar3 = (uVar6 >> 0x2d | uVar6 * 0x80000) * 0x8648dbdb ^ uVar3 * 0x2f5870a5;
    uVar6 = uVar5 * 0x8c197ea3900ca59 + uVar3;
    (this->state).v[0] = uVar3;
    (this->state).v[1] = (uVar6 >> 0x2d | uVar6 * 0x80000) * 0xc83a91e1 ^ uVar11;
  }
  lVar10 = (long)this + (lVar2 - (long)paVar7);
  if (7 < lVar10) {
    puVar1 = paVar7->b;
    paVar7 = (anon_struct_32_1_54a39802_for_input *)(paVar7->b + 8);
    uVar3 = uVar3 + *(long *)puVar1 * 0x7bdec03b;
    uVar3 = uVar3 >> 0x21 | uVar3 * 0x80000000;
    uVar6 = uVar3 * 0x16e8b05e33f3b607 + (this->state).v[1];
    uVar3 = (uVar6 >> 0x1b | uVar6 << 0x25) * 0x8648dbdb ^ uVar3 * 0x2f5870a5;
    lVar10 = (long)this + (lVar2 - (long)paVar7);
    (this->state).v[0] = uVar3;
  }
  if (3 < lVar10) {
    puVar1 = paVar7->b;
    paVar7 = (anon_struct_32_1_54a39802_for_input *)(paVar7->b + 4);
    uVar6 = (ulong)*(uint *)puVar1 * 0x7bdec03b + (this->state).v[1];
    uVar6 = uVar6 >> 0x21 | uVar6 * 0x80000000;
    uVar5 = uVar6 * 0x8c197ea3900ca59 + uVar3;
    lVar10 = (long)this + (lVar2 - (long)paVar7);
    (this->state).v[1] = (uVar5 >> 0x2e | uVar5 * 0x40000) * 0xc83a91e1 ^ uVar6 * 0x2f5870a5;
  }
  if (1 < lVar10) {
    puVar1 = paVar7->b;
    paVar7 = (anon_struct_32_1_54a39802_for_input *)(paVar7->b + 2);
    lVar10 = (long)this + (lVar2 - (long)paVar7);
    uVar3 = (ulong)*(ushort *)puVar1 * 0x7bdec03b + uVar3;
    uVar3 = uVar3 >> 0x21 | uVar3 * 0x80000000;
    uVar6 = uVar3 * 0x16e8b05e33f3b607 + (this->state).v[1];
    uVar3 = (uVar6 >> 0x16 | uVar6 << 0x2a) * 0x8648dbdb ^ uVar3 * 0x2f5870a5;
    (this->state).v[0] = uVar3;
  }
  if (lVar10 < 1) {
    uVar6 = (this->state).v[1];
  }
  else {
    uVar6 = (ulong)paVar7->b[0] * 0x7bdec03b + (this->state).v[1];
    uVar5 = uVar6 >> 0x21 | uVar6 * 0x80000000;
    uVar6 = uVar5 * 0x8c197ea3900ca59 + uVar3;
    uVar6 = (uVar6 >> 0x3a | uVar6 * 0x40) * 0xc83a91e1 ^ uVar5 * 0x2f5870a5;
  }
  uVar5 = uVar3 * 0xc83a91e1 + uVar6;
  lVar10 = (uVar5 >> 0xd | uVar5 << 0x33) + uVar3;
  uVar3 = uVar6 * 0x8648dbdb + lVar10;
  lVar2 = (uVar3 >> 0x25 | uVar3 * 0x8000000) + uVar6;
  uVar3 = lVar10 * 0x7bdec03b + lVar2;
  uVar4 = (uVar3 >> 0xd | uVar3 << 0x33) + lVar10;
  uVar3 = lVar2 * 0x2f5870a5 + uVar4;
  (this->state).v[0] = uVar4;
  (this->state).v[1] = (uVar3 >> 0x25 | uVar3 * 0x8000000) + lVar2;
  this->bytes = 0;
  uVar4 = (this->state).v[1];
  *(uint64_t *)hash = (this->state).v[0];
  *(uint64_t *)(hash + 8) = uVar4;
  return;
}

Assistant:

void MetroHash128::Finalize(uint8_t * const hash)
{
    // finalize bulk loop, if used
    if (bytes >= 32)
    {
        state.v[2] ^= rotate_right(((state.v[0] + state.v[3]) * k0) + state.v[1], 21) * k1;
        state.v[3] ^= rotate_right(((state.v[1] + state.v[2]) * k1) + state.v[0], 21) * k0;
        state.v[0] ^= rotate_right(((state.v[0] + state.v[2]) * k0) + state.v[3], 21) * k1;
        state.v[1] ^= rotate_right(((state.v[1] + state.v[3]) * k1) + state.v[2], 21) * k0;
    }
    
    // process any bytes remaining in the input buffer
    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(input.b);
    const uint8_t * const end = ptr + (bytes % 32);
    
    if ((end - ptr) >= 16)
    {
        state.v[0] += read_u64(ptr) * k2; ptr += 8; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[1] += read_u64(ptr) * k2; ptr += 8; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 45) * k1;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 45) * k0;
    }

    if ((end - ptr) >= 8)
    {
        state.v[0] += read_u64(ptr) * k2; ptr += 8; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 27) * k1;
    }

    if ((end - ptr) >= 4)
    {
        state.v[1] += read_u32(ptr) * k2; ptr += 4; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 46) * k0;
    }

    if ((end - ptr) >= 2)
    {
        state.v[0] += read_u16(ptr) * k2; ptr += 2; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 22) * k1;
    }

    if ((end - ptr) >= 1)
    {
        state.v[1] += read_u8 (ptr) * k2; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 58) * k0;
    }
    
    state.v[0] += rotate_right((state.v[0] * k0) + state.v[1], 13);
    state.v[1] += rotate_right((state.v[1] * k1) + state.v[0], 37);
    state.v[0] += rotate_right((state.v[0] * k2) + state.v[1], 13);
    state.v[1] += rotate_right((state.v[1] * k3) + state.v[0], 37);

    bytes = 0;

    // do any endian conversion here

    memcpy(hash, state.v, 16);
}